

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

bool __thiscall QOpenGL2PaintEngineEx::end(QOpenGL2PaintEngineEx *this)

{
  long lVar1;
  QOpenGL2PaintEngineExPrivate *pQVar2;
  QOpenGLPaintDevicePrivate *pQVar3;
  QOpenGL2PaintEngineExPrivate *this_00;
  QOpenGLContextPrivate *pQVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QOpenGLContext *ctx;
  QOpenGL2PaintEngineExPrivate *d;
  undefined8 in_stack_ffffffffffffffc8;
  GLuint program;
  QBrush *this_01;
  QOpenGLFunctions *in_stack_ffffffffffffffd0;
  QOpenGLEngineShaderManager *this_02;
  EngineMode newMode;
  QOpenGL2PaintEngineExPrivate *in_stack_fffffffffffffff0;
  
  newMode = (EngineMode)((ulong)in_RDI >> 0x20);
  program = (GLuint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QOpenGL2PaintEngineEx *)0x1660c5);
  pQVar3 = QOpenGLPaintDevicePrivate::get((QOpenGLPaintDevice *)0x1660db);
  (*pQVar3->_vptr_QOpenGLPaintDevicePrivate[3])();
  this_00 = (QOpenGL2PaintEngineExPrivate *)
            QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x1660f5);
  QOpenGLFunctions::glUseProgram(in_stack_ffffffffffffffd0,program);
  QOpenGL2PaintEngineExPrivate::transferMode(in_stack_fffffffffffffff0,newMode);
  pQVar4 = QOpenGLContext::d_func((QOpenGLContext *)0x166126);
  *(undefined8 *)(pQVar4 + 0x100) = 0;
  QOpenGL2PaintEngineExPrivate::resetGLState(this_00);
  this_02 = pQVar2->shaderManager;
  if (this_02 != (QOpenGLEngineShaderManager *)0x0) {
    (**(code **)(*(long *)this_02 + 0x20))();
  }
  pQVar2->shaderManager = (QOpenGLEngineShaderManager *)0x0;
  this_01 = (QBrush *)&stack0xfffffffffffffff0;
  QBrush::QBrush(this_01);
  QBrush::operator=((QBrush *)this_02,this_01);
  QBrush::~QBrush(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGL2PaintEngineEx::end()
{
    Q_D(QOpenGL2PaintEngineEx);

    QOpenGLPaintDevicePrivate::get(d->device)->endPaint();

    QOpenGLContext *ctx = d->ctx;
    d->funcs.glUseProgram(0);
    d->transferMode(BrushDrawingMode);

    ctx->d_func()->active_engine = nullptr;

    d->resetGLState();

    delete d->shaderManager;
    d->shaderManager = nullptr;
    d->currentBrush = QBrush();

#ifdef QT_OPENGL_CACHE_AS_VBOS
    if (!d->unusedVBOSToClean.isEmpty()) {
        glDeleteBuffers(d->unusedVBOSToClean.size(), d->unusedVBOSToClean.constData());
        d->unusedVBOSToClean.clear();
    }
    if (!d->unusedIBOSToClean.isEmpty()) {
        glDeleteBuffers(d->unusedIBOSToClean.size(), d->unusedIBOSToClean.constData());
        d->unusedIBOSToClean.clear();
    }
#endif

    return false;
}